

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void errline(int n,int k,FILE *err)

{
  size_t sVar1;
  char *__format;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (*argv != (char *)0x0) {
    fputs(*argv,(FILE *)err);
  }
  sVar1 = strlen(*argv);
  lVar4 = (long)((int)sVar1 + 1);
  uVar3 = 1;
  if (1 < n) {
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      if (argv[uVar2] == (char *)0x0) break;
      fprintf((FILE *)err," %s");
      sVar1 = strlen(argv[uVar2]);
      lVar4 = lVar4 + ((long)((sVar1 << 0x20) + 0x100000000) >> 0x20);
      uVar2 = uVar2 + 1;
      uVar3 = (ulong)(uint)n;
    } while ((uint)n != uVar2);
  }
  uVar2 = k + lVar4;
  if (argv[uVar3 & 0xffffffff] != (char *)0x0) {
    lVar4 = (uVar3 & 0xffffffff) * 8;
    do {
      lVar4 = lVar4 + 8;
      fprintf((FILE *)err," %s");
    } while (*(long *)((long)argv + lVar4) != 0);
  }
  if (uVar2 < 0x14) {
    __format = "\n%*s^-- here\n";
  }
  else {
    uVar2 = (ulong)((int)uVar2 - 7);
    __format = "\n%*shere --^\n";
  }
  fprintf((FILE *)err,__format,uVar2 & 0xffffffff,"");
  return;
}

Assistant:

static void errline(int n, int k, FILE *err)
{
  int i;
  size_t spcnt;
  if( argv[0] ) fprintf(err,"%s",argv[0]);
  spcnt = lemonStrlen(argv[0]) + 1;
  for(i=1; i<n && argv[i]; i++){
    fprintf(err," %s",argv[i]);
    spcnt += lemonStrlen(argv[i])+1;
  }
  spcnt += k;
  for(; argv[i]; i++) fprintf(err," %s",argv[i]);
  if( spcnt<20 ){
    fprintf(err,"\n%*s^-- here\n",(int)spcnt,"");
  }else{
    fprintf(err,"\n%*shere --^\n",(int)spcnt-7,"");
  }
}